

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indonesia.h
# Opt level: O0

void __thiscall NTB::NTB(NTB *this)

{
  NTB1 *this_00;
  Bali *this_01;
  Lombok *this_02;
  NTB *this_local;
  
  this_00 = (NTB1 *)operator_new(0x50);
  NTB1::NTB1(this_00);
  this->ntb = this_00;
  this_01 = (Bali *)operator_new(0x50);
  Bali::Bali(this_01);
  this->bali = this_01;
  this_02 = (Lombok *)operator_new(0x50);
  Lombok::Lombok(this_02);
  this->lombok = this_02;
  Polygon::resizeCenter(1.0);
  Polygon::move((int)this->ntb,100);
  Polygon::resizeCenter(0.2);
  Polygon::move((int)this->bali,-0xfa);
  Polygon::resizeCenter(0.15);
  Polygon::move((int)this->lombok,-0x32);
  return;
}

Assistant:

NTB() {     
      ntb = new NTB1();
      bali = new Bali();
      lombok = new Lombok();
      ntb->resizeCenter(1);
      ntb->move(100,-30);
      bali->resizeCenter(0.2);
      bali->move(-250,0);
      lombok->resizeCenter(0.15);
      lombok->move(-50,-80);
    }